

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_incremental_refresh_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
::
handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)83>,Fixpp::TagT<131u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<117u,Fixpp::Type::String>>,Fixpp::TagT<301u,Fixpp::Type::Int>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::TagT<132u,Fixpp::Type::Float>,Fixpp::TagT<133u,Fixpp::Type::Float>,Fixpp::TagT<134u,Fixpp::Type::Float>,Fixpp::TagT<135u,Fixpp::Type::Float>,Fixpp::TagT<62u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<188u,Fixpp::Type::Float>,Fixpp::TagT<190u,Fixpp::Type::Float>,Fixpp::TagT<189u,Fixpp::Type::Float>,Fixpp::TagT<191u,Fixpp::Type::Float>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<64u,Fixpp::Type::String>,Fixpp::TagT<40u,Fixpp::Type::Char>,Fixpp::TagT<193u,Fixpp::Type::String>,Fixpp::TagT<192u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::TypedParsingContext<void>>
          (undefined8 param_1,Token *valueToken,long message,undefined8 param_4,int tag)

{
  pair<const_char_*,_unsigned_long> local_30;
  int local_1c [2];
  int tag_local;
  
  local_1c[0] = tag;
  local_30 = StreamCursor::Token::view(valueToken);
  llvm::
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<131u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<117u,Fixpp::Type::String>>,Fixpp::TagT<301u,Fixpp::Type::Int>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::TagT<132u,Fixpp::Type::Float>,Fixpp::TagT<133u,Fixpp::Type::Float>,Fixpp::TagT<134u,Fixpp::Type::Float>,Fixpp::TagT<135u,Fixpp::Type::Float>,Fixpp::TagT<62u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<188u,Fixpp::Type::Float>,Fixpp::TagT<190u,Fixpp::Type::Float>,Fixpp::TagT<189u,Fixpp::Type::Float>,Fixpp::TagT<191u,Fixpp::Type::Float>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<64u,Fixpp::Type::String>,Fixpp::TagT<40u,Fixpp::Type::Char>,Fixpp::TagT<193u,Fixpp::Type::String>,Fixpp::TagT<192u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>>::Unparsed>
  ::emplace_back<int&,std::pair<char_const*,unsigned_long>>
            ((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<131u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<117u,Fixpp::Type::String>>,Fixpp::TagT<301u,Fixpp::Type::Int>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::TagT<132u,Fixpp::Type::Float>,Fixpp::TagT<133u,Fixpp::Type::Float>,Fixpp::TagT<134u,Fixpp::Type::Float>,Fixpp::TagT<135u,Fixpp::Type::Float>,Fixpp::TagT<62u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<188u,Fixpp::Type::Float>,Fixpp::TagT<190u,Fixpp::Type::Float>,Fixpp::TagT<189u,Fixpp::Type::Float>,Fixpp::TagT<191u,Fixpp::Type::Float>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<64u,Fixpp::Type::String>,Fixpp::TagT<40u,Fixpp::Type::Char>,Fixpp::TagT<193u,Fixpp::Type::String>,Fixpp::TagT<192u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>>::Unparsed>
              *)(message + 0x270),local_1c,&local_30);
  return;
}

Assistant:

void handleUnknownTag(const StreamCursor::Token& valueToken, Message& message, Context& /*context*/, int tag,
                                  BoolPack<false, false>)
            {
                message.unparsed.emplace_back(tag, valueToken.view());
            }